

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int query_objlist(char *qstr,obj *olist,int qflags,object_pick **pick_list,int how,
                 _func_boolean_obj_ptr *allow)

{
  int iVar1;
  boolean bVar2;
  int id;
  object_pick *poVar3;
  void *__ptr;
  char *pcVar4;
  code *__compar;
  bool bVar5;
  obj *local_b0;
  int local_a4;
  obj *local_a0;
  _func_int_void_ptr_void_ptr *objcmp_func;
  void *pvStack_88;
  int tmp_nr_objects;
  obj **tmp_objlist;
  nh_objresult *selection;
  obj **objlist;
  nh_objitem *items;
  int cur_entry;
  int nr_items;
  obj *last;
  obj *curr;
  int nr_objects;
  int prev_oclass;
  int i;
  int n;
  _func_boolean_obj_ptr *allow_local;
  object_pick **ppoStack_30;
  int how_local;
  object_pick **pick_list_local;
  obj *poStack_20;
  int qflags_local;
  obj *olist_local;
  char *qstr_local;
  
  items._4_4_ = 0;
  items._0_4_ = 0;
  objlist = (obj **)0x0;
  tmp_objlist = (obj **)0x0;
  *pick_list = (object_pick *)0x0;
  _cur_entry = (obj *)0x0;
  bVar5 = (qflags & 0x80U) != 0;
  if (bVar5) {
    _cur_entry = &zeroobj;
  }
  prev_oclass = (int)bVar5;
  last = olist;
  _i = allow;
  allow_local._4_4_ = how;
  ppoStack_30 = pick_list;
  pick_list_local._4_4_ = qflags;
  poStack_20 = olist;
  olist_local = (obj *)qstr;
  while (last != (obj *)0x0) {
    bVar2 = (*_i)(last);
    if (bVar2 != '\0') {
      _cur_entry = last;
      prev_oclass = prev_oclass + 1;
    }
    if ((pick_list_local._4_4_ & 1) == 0) {
      local_a0 = last->nobj;
    }
    else {
      local_a0 = (last->v).v_nexthere;
    }
    last = local_a0;
  }
  if (prev_oclass == 0) {
    qstr_local._4_4_ = 0;
    if ((pick_list_local._4_4_ & 0x10) != 0) {
      qstr_local._4_4_ = -1;
    }
  }
  else if ((prev_oclass == 1) && ((pick_list_local._4_4_ & 2) != 0)) {
    poVar3 = (object_pick *)malloc(0x10);
    *ppoStack_30 = poVar3;
    (*ppoStack_30)->obj = _cur_entry;
    if (_cur_entry == &zeroobj) {
      local_a4 = 1;
    }
    else {
      local_a4 = _cur_entry->quan;
    }
    (*ppoStack_30)->count = local_a4;
    qstr_local._4_4_ = 1;
  }
  else {
    curr._0_4_ = 0;
    __ptr = malloc((long)prev_oclass << 3);
    if ((pick_list_local._4_4_ & 0x80) != 0) {
      *(obj **)((long)__ptr + (long)(int)curr * 8) = &zeroobj;
      curr._0_4_ = (int)curr + 1;
    }
    last = poStack_20;
    while (last != (obj *)0x0) {
      if (((((pick_list_local._4_4_ & 0x40) != 0) && (last->otyp == 0x10e)) &&
          (bVar2 = will_feel_cockatrice(last,'\0'), bVar2 != '\0')) &&
         (u.uprops[0x21].intrinsic == 0)) {
        free(__ptr);
        look_here(0,'\0');
        return 0;
      }
      if ((((pick_list_local._4_4_ & 8) == 0) ||
          (pcVar4 = strchr(flags.inv_order,(int)last->oclass), pcVar4 != (char *)0x0)) &&
         (bVar2 = (*_i)(last), bVar2 != '\0')) {
        *(obj **)((long)__ptr + (long)(int)curr * 8) = last;
        curr._0_4_ = (int)curr + 1;
      }
      if ((pick_list_local._4_4_ & 1) == 0) {
        local_b0 = last->nobj;
      }
      else {
        local_b0 = (last->v).v_nexthere;
      }
      last = local_b0;
    }
    if ((pick_list_local._4_4_ & 8) != 0) {
      objcmp_func._4_4_ = (int)curr;
      __compar = obj_compare;
      if ((pick_list_local._4_4_ & 4) != 0) {
        __compar = invo_obj_compare;
      }
      pvStack_88 = __ptr;
      if ((pick_list_local._4_4_ & 0x80) != 0) {
        pvStack_88 = (void *)((long)__ptr + 8);
        objcmp_func._4_4_ = (int)curr + -1;
      }
      if (0 < objcmp_func._4_4_) {
        qsort(pvStack_88,(long)objcmp_func._4_4_,8,__compar);
      }
    }
    items._4_4_ = (int)curr;
    objlist = (obj **)malloc((long)(int)curr * 0x124);
    curr._4_4_ = -1;
    items._0_4_ = 0;
    nr_objects = 0;
    if ((pick_list_local._4_4_ & 0x80) != 0) {
      if ((pick_list_local._4_4_ & 8) != 0) {
        items._0_4_ = 1;
        add_objitem((nh_objitem **)&objlist,(int *)((long)&items + 4),MI_HEADING,0,0,"Furniture",
                    (obj *)0x0,'\0');
      }
      iVar1 = (int)items;
      items._0_4_ = (int)items + 1;
      add_objitem((nh_objitem **)&objlist,(int *)((long)&items + 4),MI_NORMAL,iVar1,nr_objects + 1,
                  "a magic chest",&zeroobj,'\0');
      nr_objects = nr_objects + 1;
    }
    for (; iVar1 = (int)items, nr_objects < (int)curr; nr_objects = nr_objects + 1) {
      last = *(obj **)((long)__ptr + (long)nr_objects * 8);
      if (((pick_list_local._4_4_ & 8) != 0) && (curr._4_4_ != last->oclass)) {
        items._0_4_ = (int)items + 1;
        pcVar4 = let_to_name(last->oclass,'\0');
        add_objitem((nh_objitem **)&objlist,(int *)((long)&items + 4),MI_HEADING,iVar1,0,pcVar4,last
                    ,'\0');
      }
      examine_object(last);
      iVar1 = (int)items;
      items._0_4_ = (int)items + 1;
      id = nr_objects + 1;
      pcVar4 = doname(last);
      add_objitem((nh_objitem **)&objlist,(int *)((long)&items + 4),MI_NORMAL,iVar1,id,pcVar4,last,
                  (pick_list_local._4_4_ & 4) != 0);
      curr._4_4_ = (int)last->oclass;
    }
    if (0 < (int)items) {
      tmp_objlist = (obj **)malloc((long)(int)items << 3);
      prev_oclass = display_objects((nh_objitem *)objlist,(int)items,(char *)olist_local,
                                    allow_local._4_4_,(nh_objresult *)tmp_objlist);
    }
    if (prev_oclass < 1) {
      if ((prev_oclass < 0) && (prev_oclass = 0, (pick_list_local._4_4_ & 0x20) != 0)) {
        prev_oclass = -2;
      }
    }
    else {
      poVar3 = (object_pick *)malloc((long)prev_oclass << 4);
      *ppoStack_30 = poVar3;
      for (nr_objects = 0; nr_objects < prev_oclass; nr_objects = nr_objects + 1) {
        last = *(obj **)((long)__ptr + (long)(*(int *)(tmp_objlist + nr_objects) + -1) * 8);
        (*ppoStack_30)[nr_objects].obj = last;
        if ((*(int *)((long)tmp_objlist + (long)nr_objects * 8 + 4) == -1) ||
           (last->quan < *(int *)((long)tmp_objlist + (long)nr_objects * 8 + 4))) {
          (*ppoStack_30)[nr_objects].count = last->quan;
        }
        else {
          (*ppoStack_30)[nr_objects].count = *(int *)((long)tmp_objlist + (long)nr_objects * 8 + 4);
        }
      }
    }
    free(tmp_objlist);
    free(__ptr);
    free(objlist);
    qstr_local._4_4_ = prev_oclass;
  }
  return qstr_local._4_4_;
}

Assistant:

int query_objlist(const char *qstr,	/* query string */
		  struct obj *olist,	/* the list to pick from */
		  int qflags,		/* options to control the query */
		  struct object_pick **pick_list,/* return list of items picked */
		  int how,		/* type of query */
		  boolean (*allow)(const struct obj*)) /* allow function */
{
	int n = 0, i, prev_oclass, nr_objects;
	struct obj *curr, *last;
	int nr_items = 0, cur_entry = 0;
	struct nh_objitem *items = NULL;
	struct obj **objlist = NULL;
	struct nh_objresult *selection = NULL;

	*pick_list = NULL;

	/* count the number of items allowed */
	n = 0;
	last = 0;
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* &zeroobj indicates the selection of the 'magic chest' entry */
	    last = &zeroobj;
	    n++;
	}
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((*allow)(curr)) {
		last = curr;
		n++;
	    }
	}

	if (n == 0)	/* nothing to pick here */
	    return (qflags & SIGNAL_NOMENU) ? -1 : 0;

	if (n == 1 && (qflags & AUTOSELECT_SINGLE)) {
	    *pick_list = malloc(sizeof(struct object_pick));
	    (*pick_list)->obj = last;
	    /* For a magic chest, use a valid but arbitrary count. */
	    (*pick_list)->count = cobj_is_magic_chest(last) ? 1 : last->quan;
	    return 1;
	}

	/* add all allowed objects to the list */
	nr_objects = 0;
	objlist = malloc(n * sizeof(struct obj*));
	if (qflags & SHOW_MAGIC_CHEST)
	    objlist[nr_objects++] = &zeroobj;
	for (curr = olist; curr; curr = FOLLOW(curr, qflags)) {
	    if ((qflags & FEEL_COCKATRICE) && curr->otyp == CORPSE &&
		    will_feel_cockatrice(curr, FALSE) && !Stoned) {
		    free(objlist);
		    look_here(0, FALSE);
		    return 0;
	    }
	    if ((!(qflags & INVORDER_SORT) || strchr(flags.inv_order, curr->oclass))
		&& (*allow)(curr))
		objlist[nr_objects++] = curr;
	}

	/* sort the list in place according to (1) inv_order and... */
	if (qflags & INVORDER_SORT) {
	    struct obj **tmp_objlist = objlist;
	    int tmp_nr_objects = nr_objects;
	    int (*objcmp_func)(const void *, const void *) =
		(qflags & USE_INVLET) ?
		    invo_obj_compare :	/* ... (2) only inv_order. */
		    obj_compare;	/* ... (2) object name. */
	    if (qflags & SHOW_MAGIC_CHEST) {
		/* Don't move 'magic chest' entry away from the top. */
		tmp_objlist++;
		tmp_nr_objects--;
	    }
	    if (tmp_nr_objects > 0)
		qsort(tmp_objlist, tmp_nr_objects, sizeof(struct obj *), objcmp_func);
	}

	/* nr_items will be greater than nr_objects, because it counts headers, too */
	nr_items = nr_objects;
	items = malloc(nr_items * sizeof(struct nh_objitem));
	prev_oclass = -1;
	cur_entry = 0;
	i = 0;
	/* magic chest comes first if it was requested */
	if (qflags & SHOW_MAGIC_CHEST) {
	    /* fudge the entries for 'magic chest' */
	    if (qflags & INVORDER_SORT) {
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
			    "Furniture", NULL, FALSE);
	    }
	    /* &zeroobj is handled specially by add_objitem */
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
			"a magic chest", &zeroobj, FALSE);
	    i++;
	}
	/* now go through the objects proper */
	for (; i < nr_objects; i++) {
	    curr = objlist[i];
	    /* if sorting, print type name */
	    if ((qflags & INVORDER_SORT) && prev_oclass != curr->oclass)
		add_objitem(&items, &nr_items, MI_HEADING, cur_entry++, 0,
		            let_to_name(curr->oclass, FALSE), curr, FALSE);
	    /* add the object to the list */
	    examine_object(curr);
	    add_objitem(&items, &nr_items, MI_NORMAL, cur_entry++, i+1,
	                doname(curr), curr, (qflags & USE_INVLET) != 0);
	    prev_oclass = curr->oclass;
	}

	if (cur_entry > 0) {
	    selection = malloc(cur_entry * sizeof(struct nh_objresult));
	    n = display_objects(items, cur_entry, qstr, how, selection);
	}

	if (n > 0) {
	    *pick_list = malloc(n * sizeof(struct object_pick));

	    for (i = 0; i < n; i++) {
		curr = objlist[selection[i].id - 1];
		(*pick_list)[i].obj = curr;
		if (selection[i].count == -1 || selection[i].count > curr->quan)
		    (*pick_list)[i].count = curr->quan;
		else
		    (*pick_list)[i].count = selection[i].count;
	    }
	} else if (n < 0) {
	    /* callers don't expect -1 by this point */
	    n = (qflags & SIGNAL_ESCAPE) ? -2 : 0;
	}
	free(selection);
	free(objlist);
	free(items);

	return n;
}